

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O0

ExactFloat operator*(ExactFloat *a,ExactFloat *b)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  BIGNUM *r_00;
  BIGNUM *a_00;
  BIGNUM *b_00;
  ExactFloat *in_RDX;
  BIGNUM *extraout_RDX;
  BIGNUM *extraout_RDX_00;
  BigNum BVar4;
  BIGNUM *extraout_RDX_01;
  ExactFloat EVar5;
  bool local_89;
  S2LogMessage local_70;
  S2LogMessageVoidify local_59;
  BN_CTX *local_58;
  BN_CTX *ctx;
  byte local_39;
  S2LogMessage local_38;
  S2LogMessageVoidify local_25;
  int local_24;
  ExactFloat *pEStack_20;
  int result_sign;
  ExactFloat *b_local;
  ExactFloat *a_local;
  ExactFloat *r;
  
  local_24 = b->sign_ * in_RDX->sign_;
  pEStack_20 = in_RDX;
  b_local = b;
  a_local = a;
  bVar1 = ExactFloat::is_normal(b);
  if ((bVar1) && (bVar1 = ExactFloat::is_normal(pEStack_20), bVar1)) {
    ctx._3_1_ = 0;
    ExactFloat::ExactFloat(a);
    a->sign_ = local_24;
    a->bn_exp_ = b_local->bn_exp_ + pEStack_20->bn_exp_;
    local_58 = BN_CTX_new();
    r_00 = (BIGNUM *)ExactFloat::BigNum::get(&a->bn_);
    a_00 = (BIGNUM *)ExactFloat::BigNum::get(&b_local->bn_);
    b_00 = (BIGNUM *)ExactFloat::BigNum::get(&pEStack_20->bn_);
    iVar2 = BN_mul(r_00,a_00,b_00,local_58);
    if (iVar2 == 0) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_70,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
                 ,0x276,kFatal,(ostream *)&std::cerr);
      poVar3 = S2LogMessage::stream(&local_70);
      poVar3 = std::operator<<(poVar3,
                               "Check failed: BN_mul(r.bn_.get(), a.bn_.get(), b.bn_.get(), ctx) ");
      S2LogMessageVoidify::operator&(&local_59,poVar3);
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_70);
    }
    BN_CTX_free(local_58);
    ExactFloat::Canonicalize(a);
    BVar4.bn_ = extraout_RDX_01;
  }
  else {
    bVar1 = ExactFloat::is_nan(b_local);
    if (bVar1) {
      ExactFloat::ExactFloat(a,b_local);
      BVar4.bn_ = extraout_RDX;
    }
    else {
      bVar1 = ExactFloat::is_nan(pEStack_20);
      if (bVar1) {
        ExactFloat::ExactFloat(a,pEStack_20);
        BVar4.bn_ = extraout_RDX_00;
      }
      else {
        bVar1 = ExactFloat::is_inf(b_local);
        if (bVar1) {
          bVar1 = ExactFloat::is_zero(pEStack_20);
          if (bVar1) {
            EVar5 = ExactFloat::NaN();
            BVar4 = EVar5.bn_.bn_;
          }
          else {
            EVar5 = ExactFloat::Infinity(a,local_24);
            BVar4 = EVar5.bn_.bn_;
          }
        }
        else {
          bVar1 = ExactFloat::is_inf(pEStack_20);
          if (bVar1) {
            bVar1 = ExactFloat::is_zero(b_local);
            if (bVar1) {
              EVar5 = ExactFloat::NaN();
              BVar4 = EVar5.bn_.bn_;
            }
            else {
              EVar5 = ExactFloat::Infinity(a,local_24);
              BVar4 = EVar5.bn_.bn_;
            }
          }
          else {
            bVar1 = ExactFloat::is_zero(b_local);
            local_39 = 0;
            local_89 = true;
            if (!bVar1) {
              local_89 = ExactFloat::is_zero(pEStack_20);
            }
            if (((local_89 ^ 0xffU) & 1) != 0) {
              S2FatalLogMessage::S2FatalLogMessage
                        ((S2FatalLogMessage *)&local_38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
                         ,0x26f,kFatal,(ostream *)&std::cerr);
              local_39 = 1;
              poVar3 = S2LogMessage::stream(&local_38);
              poVar3 = std::operator<<(poVar3,"Check failed: a.is_zero() || b.is_zero() ");
              S2LogMessageVoidify::operator&(&local_25,poVar3);
            }
            if ((local_39 & 1) != 0) {
              S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
            }
            EVar5 = ExactFloat::SignedZero(a,local_24);
            BVar4 = EVar5.bn_.bn_;
          }
        }
      }
    }
  }
  EVar5.bn_.bn_ = BVar4.bn_;
  EVar5._0_8_ = a;
  return EVar5;
}

Assistant:

ExactFloat operator*(const ExactFloat& a, const ExactFloat& b) {
  int result_sign = a.sign_ * b.sign_;
  if (!a.is_normal() || !b.is_normal()) {
    // Handle zero, infinity, and NaN according to IEEE 754-2008.
    if (a.is_nan()) return a;
    if (b.is_nan()) return b;
    if (a.is_inf()) {
      // Infinity times zero yields NaN.
      if (b.is_zero()) return ExactFloat::NaN();
      return ExactFloat::Infinity(result_sign);
    }
    if (b.is_inf()) {
      if (a.is_zero()) return ExactFloat::NaN();
      return ExactFloat::Infinity(result_sign);
    }
    S2_DCHECK(a.is_zero() || b.is_zero());
    return ExactFloat::SignedZero(result_sign);
  }
  ExactFloat r;
  r.sign_ = result_sign;
  r.bn_exp_ = a.bn_exp_ + b.bn_exp_;
  BN_CTX* ctx = BN_CTX_new();
  S2_CHECK(BN_mul(r.bn_.get(), a.bn_.get(), b.bn_.get(), ctx));
  BN_CTX_free(ctx);
  r.Canonicalize();
  return r;
}